

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *jp2,OPJ_BYTE *p_cdef_header_data,OPJ_UINT32 p_cdef_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *p_value;
  ulong in_RAX;
  opj_jp2_cdef_info_t *ptr;
  opj_jp2_cdef_t *poVar1;
  char *fmt;
  ulong uVar2;
  OPJ_UINT16 *pOVar3;
  OPJ_BYTE *p_buffer;
  OPJ_UINT32 l_value;
  undefined8 uStack_38;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x57b,
                  "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_cdef_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_cdef_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x57c,
                  "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x57d,
                  "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((jp2->color).jp2_cdef != (opj_jp2_cdef_t *)0x0) {
    return 0;
  }
  if (1 < p_cdef_header_size) {
    uStack_38 = in_RAX;
    opj_read_bytes_LE(p_cdef_header_data,(OPJ_UINT32 *)((long)&uStack_38 + 4),2);
    if ((uStack_38 & 0xffff00000000) == 0) {
      fmt = "Number of channel description is equal to zero in CDEF box.\n";
      goto LAB_00127d7f;
    }
    if ((uStack_38._4_4_ & 0xffff) * 6 + 2 <= p_cdef_header_size) {
      ptr = (opj_jp2_cdef_info_t *)opj_malloc((ulong)uStack_38._4_4_ * 6);
      if (ptr == (opj_jp2_cdef_info_t *)0x0) {
        return 0;
      }
      poVar1 = (opj_jp2_cdef_t *)opj_malloc(0x10);
      (jp2->color).jp2_cdef = poVar1;
      if (poVar1 != (opj_jp2_cdef_t *)0x0) {
        poVar1->info = ptr;
        poVar1->n = uStack_38._4_2_;
        if (((jp2->color).jp2_cdef)->n == 0) {
          return 1;
        }
        pOVar3 = &ptr->asoc;
        p_buffer = p_cdef_header_data + 6;
        uVar2 = 0;
        p_value = (OPJ_UINT32 *)((long)&uStack_38 + 4);
        do {
          opj_read_bytes_LE(p_buffer + -4,p_value,2);
          ((opj_jp2_cdef_info_t *)(pOVar3 + -2))->cn = uStack_38._4_2_;
          opj_read_bytes_LE(p_buffer + -2,p_value,2);
          pOVar3[-1] = uStack_38._4_2_;
          opj_read_bytes_LE(p_buffer,p_value,2);
          *pOVar3 = uStack_38._4_2_;
          uVar2 = uVar2 + 1;
          pOVar3 = pOVar3 + 3;
          p_buffer = p_buffer + 6;
        } while (uVar2 < ((jp2->color).jp2_cdef)->n);
        return 1;
      }
      opj_free(ptr);
      return 0;
    }
  }
  fmt = "Insufficient data for CDEF box.\n";
LAB_00127d7f:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t * jp2,
                                  OPJ_BYTE * p_cdef_header_data,
                                  OPJ_UINT32 p_cdef_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_cdef_info_t *cdef_info;
    OPJ_UINT16 i;
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_cdef_header_data != 00);
    assert(p_manager != 00);
    (void)p_cdef_header_size;

    /* Part 1, I.5.3.6: 'The shall be at most one Channel Definition box
     * inside a JP2 Header box.'*/
    if (jp2->color.jp2_cdef) {
        return OPJ_FALSE;
    }

    if (p_cdef_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CDEF box.\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_cdef_header_data, &l_value, 2);        /* N */
    p_cdef_header_data += 2;

    if ((OPJ_UINT16)l_value == 0) { /* szukw000: FIXME */
        opj_event_msg(p_manager, EVT_ERROR,
                      "Number of channel description is equal to zero in CDEF box.\n");
        return OPJ_FALSE;
    }

    if (p_cdef_header_size < 2 + (OPJ_UINT32)(OPJ_UINT16)l_value * 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CDEF box.\n");
        return OPJ_FALSE;
    }

    cdef_info = (opj_jp2_cdef_info_t*) opj_malloc(l_value * sizeof(
                    opj_jp2_cdef_info_t));
    if (!cdef_info) {
        return OPJ_FALSE;
    }

    jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
    if (!jp2->color.jp2_cdef) {
        opj_free(cdef_info);
        return OPJ_FALSE;
    }
    jp2->color.jp2_cdef->info = cdef_info;
    jp2->color.jp2_cdef->n = (OPJ_UINT16) l_value;

    for (i = 0; i < jp2->color.jp2_cdef->n; ++i) {
        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Cn^i */
        p_cdef_header_data += 2;
        cdef_info[i].cn = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Typ^i */
        p_cdef_header_data += 2;
        cdef_info[i].typ = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Asoc^i */
        p_cdef_header_data += 2;
        cdef_info[i].asoc = (OPJ_UINT16) l_value;
    }

    return OPJ_TRUE;
}